

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_timecondition(connectdata *conn,Curl_send_buffer *req_buffer)

{
  curl_TimeCond cVar1;
  Curl_easy *data_00;
  CURLcode CVar2;
  char *pcVar3;
  size_t size;
  int local_fc;
  char *local_e0;
  char *condp;
  char datestr [80];
  undefined1 local_78 [4];
  CURLcode result;
  tm keeptime;
  tm *tm;
  Curl_easy *data;
  Curl_send_buffer *req_buffer_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if ((data_00->set).timecondition == CURL_TIMECOND_NONE) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    data = (Curl_easy *)req_buffer;
    req_buffer_local = (Curl_send_buffer *)conn;
    CVar2 = Curl_gmtime((data_00->set).timevalue,(tm *)local_78);
    if (CVar2 == CURLE_OK) {
      keeptime.tm_zone = local_78;
      cVar1 = (data_00->set).timecondition;
      if (cVar1 == CURL_TIMECOND_IFMODSINCE) {
        local_e0 = "If-Modified-Since";
      }
      else if (cVar1 == CURL_TIMECOND_IFUNMODSINCE) {
        local_e0 = "If-Unmodified-Since";
      }
      else {
        if (cVar1 != CURL_TIMECOND_LASTMOD) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        local_e0 = "Last-Modified";
      }
      pcVar3 = Curl_checkheaders((connectdata *)req_buffer_local,local_e0);
      if (pcVar3 == (char *)0x0) {
        if (*(int *)(keeptime.tm_zone + 0x18) == 0) {
          local_fc = 6;
        }
        else {
          local_fc = *(int *)(keeptime.tm_zone + 0x18) + -1;
        }
        curl_msnprintf((char *)&condp,0x50,"%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",local_e0,
                       Curl_wkday[local_fc],(ulong)*(uint *)(keeptime.tm_zone + 0xc),
                       Curl_month[*(int *)(keeptime.tm_zone + 0x10)],
                       *(int *)(keeptime.tm_zone + 0x14) + 0x76c,
                       *(undefined4 *)(keeptime.tm_zone + 8),*(undefined4 *)(keeptime.tm_zone + 4),
                       *(undefined4 *)keeptime.tm_zone);
        size = strlen((char *)&condp);
        conn_local._4_4_ = Curl_add_buffer((Curl_send_buffer **)&data,&condp,size);
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
    else {
      Curl_failf(data_00,"Invalid TIMEVALUE");
      conn_local._4_4_ = CVar2;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_add_timecondition(const struct connectdata *conn,
                                Curl_send_buffer *req_buffer)
{
  struct Curl_easy *data = conn->data;
  const struct tm *tm;
  struct tm keeptime;
  CURLcode result;
  char datestr[80];
  const char *condp;

  if(data->set.timecondition == CURL_TIMECOND_NONE)
    /* no condition was asked for */
    return CURLE_OK;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  switch(data->set.timecondition) {
  default:
    return CURLE_BAD_FUNCTION_ARGUMENT;

  case CURL_TIMECOND_IFMODSINCE:
    condp = "If-Modified-Since";
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    condp = "If-Unmodified-Since";
    break;
  case CURL_TIMECOND_LASTMOD:
    condp = "Last-Modified";
    break;
  }

  if(Curl_checkheaders(conn, condp)) {
    /* A custom header was specified; it will be sent instead. */
    return CURLE_OK;
  }

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  msnprintf(datestr, sizeof(datestr),
            "%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
            condp,
            Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
            tm->tm_mday,
            Curl_month[tm->tm_mon],
            tm->tm_year + 1900,
            tm->tm_hour,
            tm->tm_min,
            tm->tm_sec);

  result = Curl_add_buffer(&req_buffer, datestr, strlen(datestr));

  return result;
}